

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_host(ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  size_t sVar1;
  void *pvVar2;
  uint uVar3;
  u_char **ppuVar4;
  
  sVar1 = (r->headers_in).server.len;
  if (sVar1 == 0) {
    pvVar2 = r->srv_conf[ngx_http_core_module.ctx_index];
    uVar3 = *(uint *)v & 0xf0000000 | *(uint *)((long)pvVar2 + 0x30) & 0xfffffff;
    *(uint *)v = uVar3;
    ppuVar4 = (u_char **)((long)pvVar2 + 0x38);
  }
  else {
    uVar3 = *(uint *)v & 0xf0000000 | (uint)sVar1 & 0xfffffff;
    *(uint *)v = uVar3;
    ppuVar4 = &(r->headers_in).server.data;
  }
  v->data = *ppuVar4;
  *(uint *)v = uVar3 & 0x8fffffff | 0x10000000;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_host(ngx_http_request_t *r, ngx_http_variable_value_t *v,
    uintptr_t data)
{
    ngx_http_core_srv_conf_t  *cscf;

    if (r->headers_in.server.len) {
        v->len = r->headers_in.server.len;
        v->data = r->headers_in.server.data;

    } else {
        cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

        v->len = cscf->server_name.len;
        v->data = cscf->server_name.data;
    }

    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    return NGX_OK;
}